

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O3

bool capnp::compiler::anon_unknown_0::checkChange
               (Reader file1,Reader file2,ChangeKind changeKind,uint sharedOrdinalCount)

{
  Reader file;
  Reader file_00;
  MallocMessageBuilder *pMVar1;
  ExceptionCallback *pEVar2;
  Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> *messageBuilder;
  int line;
  bool bVar3;
  char *condition;
  char *in_R9;
  DebugComparison<kj::Maybe<kj::Exception>_&,_const_kj::None_&> _kjCondition;
  SchemaLoader loader;
  Maybe<kj::Exception> exception;
  SegmentReader *params;
  Fault local_3e0;
  Disposer *local_3d8;
  undefined1 local_3cc [4];
  Maybe<kj::Own<capnp::MallocMessageBuilder,_std::nullptr_t>_> local_3c8;
  DebugComparison<kj::Maybe<kj::Exception>_&,_const_kj::None_&> local_3b0;
  SchemaLoader local_388;
  Maybe<kj::Exception> local_360;
  Maybe<kj::Exception> local_1c8;
  
  local_3c8.ptr.disposer = (Disposer *)0x0;
  local_3c8.ptr.ptr = (MallocMessageBuilder *)0x0;
  local_3cc = (undefined1  [4])changeKind;
  if (changeKind != INCOMPATIBLE) {
    kj::heap<capnp::MallocMessageBuilder>();
    local_3c8.ptr.disposer = (Disposer *)CONCAT71(local_360.ptr._1_7_,local_360.ptr.isSet);
    local_3c8.ptr.ptr = (MallocMessageBuilder *)local_360.ptr.field_1.value.ownFile.content.ptr;
  }
  pMVar1 = local_3c8.ptr.ptr;
  local_3d8 = local_3c8.ptr.disposer;
  SchemaLoader::SchemaLoader(&local_388);
  file._reader.capTable = file1._reader.capTable;
  file._reader.segment = file1._reader.segment;
  file._reader.data = file1._reader.data;
  file._reader.pointers = file1._reader.pointers;
  file._reader.dataSize = file1._reader.dataSize;
  file._reader.pointerCount = file1._reader.pointerCount;
  file._reader._38_2_ = file1._reader._38_2_;
  file._reader.nestingLimit = file1._reader.nestingLimit;
  file._reader._44_4_ = file1._reader._44_4_;
  loadFile(&local_1c8,file,&local_388,true,&local_3c8,sharedOrdinalCount);
  if (local_1c8.ptr.isSet == true) {
    kj::Exception::~Exception(&local_1c8.ptr.field_1.value);
  }
  messageBuilder = &local_3c8;
  condition = (char *)(ulong)sharedOrdinalCount;
  file_00._reader.capTable = file2._reader.capTable;
  file_00._reader.segment = file2._reader.segment;
  file_00._reader.data = file2._reader.data;
  file_00._reader.pointers = file2._reader.pointers;
  file_00._reader.dataSize = file2._reader.dataSize;
  file_00._reader.pointerCount = file2._reader.pointerCount;
  file_00._reader._38_2_ = file2._reader._38_2_;
  file_00._reader.nestingLimit = file2._reader.nestingLimit;
  file_00._reader._44_4_ = file2._reader._44_4_;
  params = file2._reader.segment;
  loadFile(&local_360,file_00,&local_388,false,messageBuilder,sharedOrdinalCount);
  if (changeKind == INCOMPATIBLE) {
    local_3b0.right = (None *)&kj::none;
    local_3b0.op.content.ptr = " != ";
    local_3b0.op.content.size_ = 5;
    local_3b0.result = local_360.ptr.isSet;
    local_3b0.left = &local_360;
    if (local_360.ptr.isSet == false) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<kj::Maybe<kj::Exception>&,kj::None_const&>&,capnp::compiler::ParsedFile::Reader&,capnp::compiler::ParsedFile::Reader&>
                (&local_3e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2eb,FAILED,"exception != kj::none","_kjCondition,file1, file2",&local_3b0,&file1
                 ,&file2);
      kj::_::Debug::Fault::fatal(&local_3e0);
    }
  }
  else {
    if (changeKind != COMPATIBLE) {
      local_3b0.left = (Maybe<kj::Exception> *)local_3cc;
      local_3b0.right = (None *)CONCAT44(local_3b0.right._4_4_,3);
      local_3b0.op.content.ptr = " == ";
      local_3b0.op.content.size_ = 5;
      local_3b0.result = changeKind == SUBTLY_COMPATIBLE;
      if (!local_3b0.result) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind&,capnp::compiler::(anonymous_namespace)::ChangeKind>&>
                  (&local_3e0,(char *)&local_3b0,line,(Type)messageBuilder,condition,in_R9,
                   (DebugComparison<capnp::compiler::(anonymous_namespace)::ChangeKind_&,_capnp::compiler::(anonymous_namespace)::ChangeKind>
                    *)params);
        kj::_::Debug::Fault::fatal(&local_3e0);
      }
      bVar3 = true;
      goto LAB_00110380;
    }
    bVar3 = true;
    if (local_360.ptr.isSet != true) goto LAB_00110380;
    pEVar2 = kj::getExceptionCallback();
    (*pEVar2->_vptr_ExceptionCallback[3])(pEVar2,&local_360.ptr.field_1);
  }
  bVar3 = false;
LAB_00110380:
  if (local_360.ptr.isSet == true) {
    kj::Exception::~Exception(&local_360.ptr.field_1.value);
  }
  SchemaLoader::~SchemaLoader(&local_388);
  if (pMVar1 != (MallocMessageBuilder *)0x0) {
    local_3c8.ptr.ptr = (MallocMessageBuilder *)0x0;
    (**local_3d8->_vptr_Disposer)(local_3d8,(long)pMVar1 + *(long *)(*(long *)pMVar1 + -0x10));
  }
  return bVar3;
}

Assistant:

bool checkChange(ParsedFile::Reader file1, ParsedFile::Reader file2, ChangeKind changeKind,
                 uint sharedOrdinalCount) {
  // Try loading file1 followed by file2 into the same SchemaLoader, expecting it to behave
  // according to changeKind.  Returns true if the files are both expected to be compatible and
  // actually are -- the main loop uses this to decide which version to keep

  kj::Maybe<kj::Own<MallocMessageBuilder>> exampleBuilder;

  if (changeKind != INCOMPATIBLE) {
    // For COMPATIBLE and SUBTLY_COMPATIBLE changes, build an example message with one schema
    // and check it with the other.
    exampleBuilder = kj::heap<MallocMessageBuilder>();
  }

  SchemaLoader loader;
  loadFile(file1, loader, true, exampleBuilder, sharedOrdinalCount);
  auto exception = loadFile(file2, loader, false, exampleBuilder, sharedOrdinalCount);

  if (changeKind == COMPATIBLE) {
    KJ_IF_SOME(e, exception) {
      kj::getExceptionCallback().onFatalException(kj::mv(e));
      return false;
    } else {
      return true;
    }
  } else if (changeKind == INCOMPATIBLE) {
    KJ_ASSERT(exception != kj::none, file1, file2);
    return false;
  } else {
    KJ_ASSERT(changeKind == SUBTLY_COMPATIBLE);

    // SchemaLoader is allowed to throw an exception in this case, but we ignore it.
    return true;
  }
}